

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRboStateQueryTests.cpp
# Opt level: O3

void __thiscall deqp::gles3::Functional::anon_unknown_1::RboSizeCase::test(RboSizeCase *this)

{
  CallLogWrapper *this_00;
  deUint32 dVar1;
  deUint32 dVar2;
  int iVar3;
  GLuint renderbufferID;
  Random rnd;
  GLuint local_44;
  deRandom local_40;
  
  deRandom_init(&local_40,0xabcdef);
  local_44 = 0;
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  glu::CallLogWrapper::glGenRenderbuffers(this_00,1,&local_44);
  glu::CallLogWrapper::glBindRenderbuffer(this_00,0x8d41,local_44);
  ApiCase::expectError(&this->super_ApiCase,0);
  checkRenderbufferParam
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
             0x8d42,0);
  checkRenderbufferParam
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
             0x8d43,0);
  ApiCase::expectError(&this->super_ApiCase,0);
  iVar3 = 0x3c;
  do {
    dVar1 = deRandom_getUint32(&local_40);
    dVar2 = deRandom_getUint32(&local_40);
    glu::CallLogWrapper::glRenderbufferStorage(this_00,0x8d41,0x8051,dVar1 % 0x81,dVar2 % 0x81);
    checkRenderbufferParam
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
               0x8d42,dVar1 % 0x81);
    checkRenderbufferParam
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
               0x8d43,dVar2 % 0x81);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  glu::CallLogWrapper::glDeleteRenderbuffers(this_00,1,&local_44);
  return;
}

Assistant:

void test (void)
	{
		de::Random rnd(0xabcdef);

		GLuint renderbufferID = 0;
		glGenRenderbuffers(1, &renderbufferID);
		glBindRenderbuffer(GL_RENDERBUFFER, renderbufferID);
		expectError(GL_NO_ERROR);

		checkRenderbufferParam(m_testCtx, *this, GL_RENDERBUFFER_WIDTH,		0);
		checkRenderbufferParam(m_testCtx, *this, GL_RENDERBUFFER_HEIGHT,	0);
		expectError(GL_NO_ERROR);

		const int numIterations = 60;
		for (int i = 0; i < numIterations; ++i)
		{
			const GLint w = rnd.getInt(0, 128);
			const GLint h = rnd.getInt(0, 128);

			glRenderbufferStorage(GL_RENDERBUFFER, GL_RGB8, w, h);

			checkRenderbufferParam(m_testCtx, *this, GL_RENDERBUFFER_WIDTH,		w);
			checkRenderbufferParam(m_testCtx, *this, GL_RENDERBUFFER_HEIGHT,	h);
		}

		glDeleteRenderbuffers(1, &renderbufferID);
	}